

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::puconversion::knownConversions(double val,unit_data *start,unit_data *result)

{
  unit_data *puVar1;
  unit_data *puVar2;
  bool bVar3;
  bool local_59;
  unit_data local_4c;
  unit_data local_48;
  unit_data local_44;
  unit_data local_40;
  unit_data local_3c;
  unit_data local_38;
  unit_data local_34;
  unit_data local_30;
  unit_data local_2c;
  unit_data *local_28;
  unit_data *result_local;
  unit_data *start_local;
  double val_local;
  
  local_28 = result;
  result_local = start;
  start_local = (unit_data *)val;
  local_2c = units::unit::base_units((unit *)&puOhm);
  bVar3 = detail::unit_data::has_same_base(start,&local_2c);
  puVar2 = result_local;
  puVar1 = local_28;
  if (bVar3) {
    local_30 = units::unit::base_units((unit *)&puMW);
    bVar3 = detail::unit_data::has_same_base(puVar1,&local_30);
    puVar1 = local_28;
    local_59 = true;
    if (!bVar3) {
      local_34 = units::unit::base_units((unit *)&puA);
      local_59 = detail::unit_data::has_same_base(puVar1,&local_34);
    }
    if (local_59 != false) {
      return 1.0 / (double)start_local;
    }
  }
  else {
    local_38 = units::unit::base_units((unit *)&puA);
    bVar3 = detail::unit_data::has_same_base(puVar2,&local_38);
    puVar2 = result_local;
    puVar1 = local_28;
    if (bVar3) {
      local_3c = units::unit::base_units((unit *)&puMW);
      bVar3 = detail::unit_data::has_same_base(puVar1,&local_3c);
      puVar1 = local_28;
      if (bVar3) {
        return (double)start_local;
      }
      local_40 = units::unit::base_units((unit *)&puOhm);
      bVar3 = detail::unit_data::has_same_base(puVar1,&local_40);
      if (bVar3) {
        return 1.0 / (double)start_local;
      }
    }
    else {
      local_44 = units::unit::base_units((unit *)&puMW);
      bVar3 = detail::unit_data::has_same_base(puVar2,&local_44);
      puVar1 = local_28;
      if (bVar3) {
        local_48 = units::unit::base_units((unit *)&puA);
        bVar3 = detail::unit_data::has_same_base(puVar1,&local_48);
        puVar1 = local_28;
        if (bVar3) {
          return (double)start_local;
        }
        local_4c = units::unit::base_units((unit *)&puOhm);
        bVar3 = detail::unit_data::has_same_base(puVar1,&local_4c);
        if (bVar3) {
          return 1.0 / (double)start_local;
        }
      }
    }
  }
  return NAN;
}

Assistant:

inline double knownConversions(
        double val,
        const detail::unit_data& start,
        const detail::unit_data& result)
    {
        if (start.has_same_base(puOhm.base_units())) {
            if (result.has_same_base(puMW.base_units()) ||
                result.has_same_base(puA.base_units())) {  // V^2/R assuming
                                                           // voltage=1.0 pu; or
                                                           // //I=V/R
                return 1.0 / val;
            }
        } else if (start.has_same_base(puA.base_units())) {
            if (result.has_same_base(puMW.base_units())) {  // P=IV assuming
                                                            // voltage=1.0 pu or
                                                            // //R=V/I
                return val;
            }
            if (result.has_same_base(
                    puOhm.base_units())) {  // P=IV assuming
                                            // voltage=1.0 pu or
                                            // //R=V/I
                return 1.0 / val;
            }
        } else if (start.has_same_base(
                       puMW.base_units())) {  // P=IV, or P=V^2/R
            if (result.has_same_base(
                    puA.base_units())) {  // IV assuming voltage=1.0 pu or
                return val;
            }
            if (result.has_same_base(puOhm.base_units())) {
                return 1.0 / val;
            }
        }
        return constants::invalid_conversion;
    }